

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O0

int duckdb_re2::runetochar(char *str,Rune *rune)

{
  uint c;
  Rune *rune_local;
  char *str_local;
  int local_4;
  
  c = *rune;
  if (c < 0x80) {
    *str = (byte)c;
    local_4 = 1;
  }
  else if (c < 0x800) {
    *str = (byte)(c >> 6) | 0xc0;
    str[1] = (byte)c & 0x3f | 0x80;
    local_4 = 2;
  }
  else {
    if (0x10ffff < c) {
      c = 0xfffd;
    }
    if (c < 0x10000) {
      *str = (byte)(c >> 0xc) | 0xe0;
      str[1] = (byte)(c >> 6) & 0x3f | 0x80;
      str[2] = (byte)c & 0x3f | 0x80;
      local_4 = 3;
    }
    else {
      *str = (byte)(c >> 0x12) | 0xf0;
      str[1] = (byte)(c >> 0xc) & 0x3f | 0x80;
      str[2] = (byte)(c >> 6) & 0x3f | 0x80;
      str[3] = (byte)c & 0x3f | 0x80;
      local_4 = 4;
    }
  }
  return local_4;
}

Assistant:

int
runetochar(char *str, const Rune *rune)
{
	/* Runes are signed, so convert to unsigned for range check. */
	unsigned int c;

	/*
	 * one character sequence
	 *	00000-0007F => 00-7F
	 */
	c = *rune;
	if(c <= Rune1) {
		str[0] = static_cast<char>(c);
		return 1;
	}

	/*
	 * two character sequence
	 *	0080-07FF => T2 Tx
	 */
	if(c <= Rune2) {
		str[0] = T2 | static_cast<char>(c >> 1*Bitx);
		str[1] = Tx | (c & Maskx);
		return 2;
	}

	/*
	 * If the Rune is out of range, convert it to the error rune.
	 * Do this test here because the error rune encodes to three bytes.
	 * Doing it earlier would duplicate work, since an out of range
	 * Rune wouldn't have fit in one or two bytes.
	 */
	if (c > Runemax)
		c = Runeerror;

	/*
	 * three character sequence
	 *	0800-FFFF => T3 Tx Tx
	 */
	if (c <= Rune3) {
		str[0] = T3 | static_cast<char>(c >> 2*Bitx);
		str[1] = Tx | ((c >> 1*Bitx) & Maskx);
		str[2] = Tx | (c & Maskx);
		return 3;
	}

	/*
	 * four character sequence (21-bit value)
	 *     10000-1FFFFF => T4 Tx Tx Tx
	 */
	str[0] = T4 | static_cast<char>(c >> 3*Bitx);
	str[1] = Tx | ((c >> 2*Bitx) & Maskx);
	str[2] = Tx | ((c >> 1*Bitx) & Maskx);
	str[3] = Tx | (c & Maskx);
	return 4;
}